

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O0

int __thiscall Omega_h::Comm::dup(Comm *this,int __fd)

{
  Comm *this_00;
  ulong *puVar1;
  undefined4 in_register_00000034;
  undefined8 *puVar2;
  bool local_75;
  Comm *this_local;
  ulong local_10;
  
  puVar2 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  this_00 = (Comm *)operator_new(0x50);
  local_75 = false;
  if (puVar2[2] != 0) {
    puVar1 = puVar2 + 1;
    if ((*puVar1 & 1) == 0) {
      local_10 = *(ulong *)*puVar1;
    }
    else {
      local_10 = *puVar1 >> 3;
    }
    local_75 = (int)(local_10 >> 2) == 1;
  }
  Comm(this_00,(Library *)*puVar2,puVar2[2] != 0,local_75);
  std::shared_ptr<Omega_h::Comm>::shared_ptr<Omega_h::Comm,void>
            ((shared_ptr<Omega_h::Comm> *)this,this_00);
  return (int)this;
}

Assistant:

CommPtr Comm::dup() const {
#ifdef OMEGA_H_USE_MPI
  MPI_Comm impl2;
  CALL(MPI_Comm_dup(impl_, &impl2));
  return CommPtr(new Comm(library_, impl2));
#else
  return CommPtr(
      new Comm(library_, srcs_.exists(), srcs_.exists() && srcs_.size() == 1));
#endif
}